

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O2

void qpdfjob_set_logger(qpdfjob_handle j,qpdflogger_handle logger)

{
  __shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,(__shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2> *)logger);
  QPDFJob::setLogger(&j->j,(shared_ptr<QPDFLogger> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

void
qpdfjob_set_logger(qpdfjob_handle j, qpdflogger_handle logger)
{
    j->j.setLogger(logger->l);
}